

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D_adaptive<vector_realloc_shrink_clear<unsigned_char*,16u>>
               (uchar **strings,size_t n,size_t depth,
               vector_realloc_shrink_clear<unsigned_char_*,_16U> *buckets)

{
  uchar *puVar1;
  long lVar2;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar3;
  size_t *psVar4;
  ushort uVar5;
  uchar **t;
  uchar **ppuVar6;
  uint i;
  size_t j_1;
  long lVar7;
  ulong uVar8;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_realloc_shrink_clear<unsigned_char*,16u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    ppuVar6 = strings;
    do {
      lVar3 = 0;
      do {
        puVar1 = ppuVar6[lVar3];
        if (puVar1 == (uchar *)0x0) goto LAB_00206940;
        if (puVar1[depth] == '\0') {
          uVar5 = 0;
        }
        else {
          uVar5 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        auStack_58[lVar3] = uVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      lVar3 = 0;
      t = ppuVar6;
      do {
        vector_realloc_shrink_clear<unsigned_char_*,_16U>::push_back(buckets + auStack_58[lVar3],t);
        lVar3 = lVar3 + 1;
        t = t + 1;
      } while (lVar3 != 0x10);
      uVar8 = uVar8 + 0x10;
      ppuVar6 = ppuVar6 + 0x10;
    } while (uVar8 < (n & 0xfffffffffffffff0));
  }
  lVar3 = n - uVar8;
  if (uVar8 <= n && lVar3 != 0) {
    ppuVar6 = strings + uVar8;
    do {
      puVar1 = *ppuVar6;
      if (puVar1 == (uchar *)0x0) {
LAB_00206940:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      vector_realloc_shrink_clear<unsigned_char_*,_16U>::push_back(buckets + uVar8,ppuVar6);
      ppuVar6 = ppuVar6 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  psVar4 = &buckets->_size;
  lVar3 = 0;
  do {
    __ptr[lVar3] = *psVar4;
    lVar3 = lVar3 + 1;
    psVar4 = psVar4 + 3;
  } while (lVar3 != 0x10000);
  psVar4 = &buckets->_size;
  lVar3 = 0;
  lVar7 = 0;
  do {
    lVar2 = __ptr[lVar3];
    if (lVar2 != 0) {
      if (*psVar4 != 0) {
        memmove(strings + lVar7,
                ((vector_realloc_shrink_clear<unsigned_char_*,_16U> *)(psVar4 + -1))->_data,
                *psVar4 << 3);
      }
      lVar7 = lVar7 + lVar2;
    }
    lVar3 = lVar3 + 1;
    psVar4 = psVar4 + 3;
  } while (lVar3 != 0x10000);
  lVar3 = 0;
  do {
    vector_realloc_shrink_clear<unsigned_char_*,_16U>::clear
              ((vector_realloc_shrink_clear<unsigned_char_*,_16U> *)((long)&buckets->_data + lVar3))
    ;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x180000);
  lVar3 = *__ptr;
  lVar7 = 1;
  do {
    n_00 = __ptr[lVar7];
    if (n_00 != 0) {
      if ((char)lVar7 != '\0') {
        msd_D_adaptive<vector_realloc_shrink_clear<unsigned_char*,16u>>
                  (strings + lVar3,n_00,depth + 2,buckets);
      }
      lVar3 = lVar3 + n_00;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}